

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerStress(void *p,PgHdr *pPg)

{
  uint uVar1;
  code *pcVar2;
  
  uVar1 = 0;
  if ((*(int *)((long)p + 0x30) == 0) &&
     ((*(byte *)((long)p + 0x19) == 0 ||
      ((uVar1 = 0, (*(byte *)((long)p + 0x19) & 3) == 0 && ((pPg->flags & 8) == 0)))))) {
    pPg->pDirty = (PgHdr *)0x0;
    if (*(long *)((long)p + 0x120) == 0) {
      if (((pPg->flags & 8) != 0) || (uVar1 = 0, *(char *)((long)p + 0x15) == '\x03')) {
        uVar1 = syncJournal((Pager *)p,1);
      }
      if (uVar1 == 0) {
        uVar1 = pager_write_pagelist((Pager *)p,pPg);
      }
    }
    else {
      uVar1 = subjournalPageIfRequired(pPg);
      if (uVar1 == 0) {
        uVar1 = pagerWalFrames((Pager *)p,pPg,0,0);
      }
    }
    if (uVar1 == 0) {
      sqlite3PcacheMakeClean(pPg);
    }
    if (((char)uVar1 == '\r') || ((uVar1 & 0xff) == 10)) {
      *(uint *)((long)p + 0x30) = uVar1;
      *(undefined1 *)((long)p + 0x15) = 6;
      if (uVar1 == 0) {
        if (*(char *)((long)p + 0x1b) == '\0') {
          pcVar2 = getPageNormal;
        }
        else {
          pcVar2 = getPageMMap;
        }
      }
      else {
        pcVar2 = getPageError;
      }
      *(code **)((long)p + 0x108) = pcVar2;
    }
  }
  return uVar1;
}

Assistant:

static int pagerStress(void *p, PgHdr *pPg){
  Pager *pPager = (Pager *)p;
  int rc = SQLITE_OK;

  assert( pPg->pPager==pPager );
  assert( pPg->flags&PGHDR_DIRTY );

  /* The doNotSpill NOSYNC bit is set during times when doing a sync of
  ** journal (and adding a new header) is not allowed.  This occurs
  ** during calls to sqlite3PagerWrite() while trying to journal multiple
  ** pages belonging to the same sector.
  **
  ** The doNotSpill ROLLBACK and OFF bits inhibits all cache spilling
  ** regardless of whether or not a sync is required.  This is set during
  ** a rollback or by user request, respectively.
  **
  ** Spilling is also prohibited when in an error state since that could
  ** lead to database corruption.   In the current implementation it 
  ** is impossible for sqlite3PcacheFetch() to be called with createFlag==3
  ** while in the error state, hence it is impossible for this routine to
  ** be called in the error state.  Nevertheless, we include a NEVER()
  ** test for the error state as a safeguard against future changes.
  */
  if( NEVER(pPager->errCode) ) return SQLITE_OK;
  testcase( pPager->doNotSpill & SPILLFLAG_ROLLBACK );
  testcase( pPager->doNotSpill & SPILLFLAG_OFF );
  testcase( pPager->doNotSpill & SPILLFLAG_NOSYNC );
  if( pPager->doNotSpill
   && ((pPager->doNotSpill & (SPILLFLAG_ROLLBACK|SPILLFLAG_OFF))!=0
      || (pPg->flags & PGHDR_NEED_SYNC)!=0)
  ){
    return SQLITE_OK;
  }

  pPg->pDirty = 0;
  if( pagerUseWal(pPager) ){
    /* Write a single frame for this page to the log. */
    rc = subjournalPageIfRequired(pPg); 
    if( rc==SQLITE_OK ){
      rc = pagerWalFrames(pPager, pPg, 0, 0);
    }
  }else{
  
    /* Sync the journal file if required. */
    if( pPg->flags&PGHDR_NEED_SYNC 
     || pPager->eState==PAGER_WRITER_CACHEMOD
    ){
      rc = syncJournal(pPager, 1);
    }
  
    /* Write the contents of the page out to the database file. */
    if( rc==SQLITE_OK ){
      assert( (pPg->flags&PGHDR_NEED_SYNC)==0 );
      rc = pager_write_pagelist(pPager, pPg);
    }
  }

  /* Mark the page as clean. */
  if( rc==SQLITE_OK ){
    PAGERTRACE(("STRESS %d page %d\n", PAGERID(pPager), pPg->pgno));
    sqlite3PcacheMakeClean(pPg);
  }

  return pager_error(pPager, rc); 
}